

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O3

int ERKStepSetOrder(void *arkode_mem,int ord)

{
  int iVar1;
  int iVar2;
  ARKodeERKStepMem step_mem;
  ARKodeMem ark_mem;
  sunindextype Bliw;
  sunindextype Blrw;
  ARKodeERKStepMem local_40;
  ARKodeMem local_38;
  int local_30;
  int local_2c;
  
  iVar1 = erkStep_AccessStepMem(arkode_mem,"ERKStepSetOrder",&local_38,&local_40);
  if (iVar1 == 0) {
    iVar2 = 4;
    if (0 < ord) {
      iVar2 = ord;
    }
    local_40->q = iVar2;
    local_40->p = 0;
    local_40->stages = 0;
    ARKodeButcherTable_Space(local_40->B,&local_30,&local_2c);
    ARKodeButcherTable_Free(local_40->B);
    local_40->B = (ARKodeButcherTable)0x0;
    local_38->liw = local_38->liw - (long)local_30;
    local_38->lrw = local_38->lrw - (long)local_2c;
  }
  return iVar1;
}

Assistant:

int ERKStepSetOrder(void *arkode_mem, int ord)
{
  ARKodeMem ark_mem;
  ARKodeERKStepMem step_mem;
  sunindextype Blrw, Bliw;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(arkode_mem, "ERKStepSetOrder",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* set user-provided value, or default, depending on argument */
  if (ord <= 0) {
    step_mem->q = Q_DEFAULT;
  } else {
    step_mem->q = ord;
  }

  /* clear Butcher tables, since user is requesting a change in method
     or a reset to defaults.  Tables will be set in ARKInitialSetup. */
  step_mem->stages = 0;
  step_mem->p = 0;

  ARKodeButcherTable_Space(step_mem->B, &Bliw, &Blrw);
  ARKodeButcherTable_Free(step_mem->B);
  step_mem->B = NULL;
  ark_mem->liw -= Bliw;
  ark_mem->lrw -= Blrw;

  return(ARK_SUCCESS);
}